

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memchr.c
# Opt level: O0

ssize_t mpt_memrchr(iovec *data,size_t ndat,int tok)

{
  char *pcVar1;
  long lVar2;
  int *piVar3;
  size_t sVar4;
  long local_40;
  uint8_t *tmp;
  size_t sStack_30;
  uint8_t match;
  size_t i;
  size_t sStack_20;
  int tok_local;
  size_t ndat_local;
  iovec *data_local;
  
  sStack_30 = ndat;
  do {
    sVar4 = sStack_30 - 1;
    if (sStack_30 == 0) {
      piVar3 = __errno_location();
      *piVar3 = 0xb;
      return -2;
    }
    local_40 = (long)data[sVar4].iov_base + data[sVar4].iov_len;
    sStack_20 = data[sVar4].iov_len;
    while (lVar2 = sStack_20 - 1, sStack_30 = sVar4, sStack_20 != 0) {
      pcVar1 = (char *)(local_40 + -1);
      local_40 = local_40 + -1;
      sStack_20 = lVar2;
      if (*pcVar1 == (char)tok) {
        do {
          if (sStack_30 == 0) {
            return sStack_20;
          }
          sStack_30 = sStack_30 - 1;
          sStack_20 = sStack_20 + data[sStack_30].iov_len;
        } while (sStack_20 < 0x8000000000000000);
        piVar3 = __errno_location();
        *piVar3 = 0x4b;
        return -1;
      }
    }
  } while( true );
}

Assistant:

extern ssize_t mpt_memrchr(const struct iovec *data, size_t ndat, int tok)
{
	size_t	i = ndat;
	
	while (i--) {
		const uint8_t match = tok, *tmp = ((uint8_t *) data[i].iov_base) + data[i].iov_len;
		
		ndat = data[i].iov_len;
		
		while (ndat--) {
			if (*(--tmp) == match) {
				while (i) {
					if ((ndat += data[--i].iov_len) > SSIZE_MAX) {
						errno = EOVERFLOW; return -1;
					}
				}
				return ndat;
			}
		}
	}
	
	errno = EAGAIN;
	
	return -2;
}